

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  cmState *this_00;
  char *pcVar4;
  string *this_01;
  ostringstream e;
  allocator local_1b1;
  string local_1b0;
  string local_190 [11];
  
  if (key == (char *)0x0) {
    pcVar4 = ExpandVariable(this,var);
    return pcVar4;
  }
  if (var == (char *)0x0) {
    return this->EmptyVariable;
  }
  iVar2 = strcmp(key,"ENV");
  if (iVar2 == 0) {
    local_190[0]._M_dataplus._M_p = (pointer)&local_190[0].field_2;
    local_190[0]._M_string_length = 0;
    local_190[0].field_2._M_local_buf[0] = '\0';
    bVar1 = cmsys::SystemTools::GetEnv(var,local_190);
    if (bVar1) {
      if (this->EscapeQuotes == true) {
        cmSystemTools::EscapeQuotes(&local_1b0,local_190);
        this = (cmCommandArgumentParserHelper *)AddString(this,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
      else {
        this = (cmCommandArgumentParserHelper *)AddString(this,local_190);
      }
    }
  }
  else {
    iVar2 = strcmp(key,"CACHE");
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      poVar3 = std::operator<<((ostream *)local_190,"Syntax $");
      poVar3 = std::operator<<(poVar3,key);
      poVar3 = std::operator<<(poVar3,"{} is not supported.  ");
      std::operator<<(poVar3,"Only ${}, $ENV{}, and $CACHE{} are allowed.");
      std::__cxx11::stringbuf::str();
      SetError(this,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      return (char *)0x0;
    }
    this_00 = cmMakefile::GetState(this->Makefile);
    std::__cxx11::string::string((string *)local_190,var,(allocator *)&local_1b0);
    pcVar4 = cmState::GetInitializedCacheValue(this_00,local_190);
    std::__cxx11::string::~string((string *)local_190);
    if (pcVar4 == (char *)0x0) {
      return this->EmptyVariable;
    }
    if (this->EscapeQuotes == true) {
      std::__cxx11::string::string((string *)&local_1b0,pcVar4,&local_1b1);
      cmSystemTools::EscapeQuotes(local_190,&local_1b0);
      this = (cmCommandArgumentParserHelper *)AddString(this,local_190);
      std::__cxx11::string::~string((string *)local_190);
      this_01 = &local_1b0;
      goto LAB_0035c72f;
    }
    std::__cxx11::string::string((string *)local_190,pcVar4,(allocator *)&local_1b0);
    this = (cmCommandArgumentParserHelper *)AddString(this,local_190);
  }
  this_01 = local_190;
LAB_0035c72f:
  std::__cxx11::string::~string((string *)this_01);
  return this->EmptyVariable;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandSpecialVariable(const char* key,
                                                           const char* var)
{
  if (!key) {
    return this->ExpandVariable(var);
  }
  if (!var) {
    return this->EmptyVariable;
  }
  if (strcmp(key, "ENV") == 0) {
    std::string str;
    if (cmSystemTools::GetEnv(var, str)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmSystemTools::EscapeQuotes(str));
      }
      return this->AddString(str);
    }
    return this->EmptyVariable;
  }
  if (strcmp(key, "CACHE") == 0) {
    if (const char* c =
          this->Makefile->GetState()->GetInitializedCacheValue(var)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmSystemTools::EscapeQuotes(c));
      }
      return this->AddString(c);
    }
    return this->EmptyVariable;
  }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return CM_NULLPTR;
}